

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesForm.cxx
# Opt level: O0

void cmCursesForm::LogMessage(char *msg)

{
  ostream *this;
  char *msg_local;
  
  if (Debug) {
    this = std::operator<<(&DebugFile.super_basic_ostream<char,_std::char_traits<char>_>,msg);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void cmCursesForm::LogMessage(const char* msg)
{
  if (!cmCursesForm::Debug)
    {
    return;
    }

  cmCursesForm::DebugFile << msg << std::endl;
}